

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_close(quicly_conn_t *conn,int err,uint64_t frame_type,ptls_iovec_t reason_phrase)

{
  undefined8 in_RCX;
  quicly_conn_t *in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  int ret;
  undefined3 in_stack_ffffffffffffffc8;
  int including_crypto_streams;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(uint *)(in_RDI + 1) < 3) {
    including_crypto_streams = CONCAT13(1,in_stack_ffffffffffffffc8);
    if (in_ESI != 0xff04) {
      including_crypto_streams = CONCAT13(in_ESI == 0xff05,in_stack_ffffffffffffffc8);
    }
    local_4 = enter_close((quicly_conn_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                          (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    if (local_4 == 0) {
      if (*(long *)(*in_RDI + 200) != 0) {
        (*(code *)**(undefined8 **)(*in_RDI + 200))
                  (*(undefined8 *)(*in_RDI + 200),in_RDI,in_ESI,in_RDX,in_RCX,in_R8);
      }
      destroy_all_streams(in_RDX,local_4,including_crypto_streams);
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int handle_close(quicly_conn_t *conn, int err, uint64_t frame_type, ptls_iovec_t reason_phrase)
{
    int ret;

    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return 0;

    /* switch to closing state, notify the app (at this moment the streams are accessible), then destroy the streams */
    if ((ret = enter_close(conn, 0,
                           !(err == QUICLY_ERROR_RECEIVED_STATELESS_RESET || err == QUICLY_ERROR_NO_COMPATIBLE_VERSION))) != 0)
        return ret;
    if (conn->super.ctx->closed_by_remote != NULL)
        conn->super.ctx->closed_by_remote->cb(conn->super.ctx->closed_by_remote, conn, err, frame_type,
                                              (const char *)reason_phrase.base, reason_phrase.len);
    destroy_all_streams(conn, err, 0);

    return 0;
}